

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ShuffleChannel_x86::forward
          (ShuffleChannel_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  uint _c;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int iVar24;
  ulong uVar25;
  void *pvVar26;
  size_t sVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  Option opt_pack;
  ulong local_150;
  ulong local_148;
  long local_138;
  long local_130;
  ulong local_128;
  Mat local_118;
  Mat local_c8;
  Option local_78;
  
  iVar38 = bottom_blob->elempack;
  if ((iVar38 == 0) || (sVar27 = bottom_blob->elemsize, ((int)sVar27 * 8) / iVar38 != 0x20)) {
    forward();
    iVar38 = -100;
  }
  else {
    _c = bottom_blob->c;
    if ((this->super_ShuffleChannel).reverse == 0) {
      iVar39 = (this->super_ShuffleChannel).group;
    }
    else {
      iVar39 = (int)(_c * iVar38) / (this->super_ShuffleChannel).group;
    }
    uVar25 = (long)(int)_c / (long)iVar39 & 0xffffffff;
    if (iVar39 == 1) {
      iVar38 = 0;
      if (top_blob != bottom_blob) {
        piVar4 = bottom_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = top_blob->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        piVar4 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar4;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar39 = bottom_blob->w;
        iVar3 = bottom_blob->h;
        iVar24 = bottom_blob->d;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar39;
        top_blob->h = iVar3;
        top_blob->d = iVar24;
        top_blob->c = bottom_blob->c;
        top_blob->cstep = bottom_blob->cstep;
      }
    }
    else {
      if (iVar38 != 4) {
LAB_0043c991:
        iVar38 = ShuffleChannel::forward(&this->super_ShuffleChannel,bottom_blob,top_blob,opt);
        return iVar38;
      }
      iVar38 = bottom_blob->w;
      iVar3 = bottom_blob->h;
      iVar28 = iVar3 * iVar38;
      iVar24 = (int)((long)(int)_c / (long)iVar39);
      if ((_c & 1) == 0 || iVar39 != 2) {
        if ((4 < iVar39) || ((int)_c % iVar39 != 0)) {
          local_78.lightmode = opt->lightmode;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_ops = opt->use_subgroup_ops;
          local_78.use_reserved_0 = opt->use_reserved_0;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          local_78.use_bf16_storage = opt->use_bf16_storage;
          local_78.use_fp16_packed = opt->use_fp16_packed;
          local_78.use_fp16_storage = opt->use_fp16_storage;
          local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          local_78.use_int8_packed = opt->use_int8_packed;
          local_78.use_int8_storage = opt->use_int8_storage;
          local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
          local_78.use_packing_layout = opt->use_packing_layout;
          local_78.vulkan_device_index = opt->vulkan_device_index;
          local_78.use_reserved_1 = opt->use_reserved_1;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_reserved_2 = opt->use_reserved_2;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_shader_local_memory = opt->use_shader_local_memory;
          local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
          local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
          local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
          local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
          local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          local_78.use_fp16_uniform = opt->use_fp16_uniform;
          local_78.use_int8_uniform = opt->use_int8_uniform;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = opt->workspace_allocator;
          local_c8.cstep = 0;
          local_c8.data = (void *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize._0_4_ = 0;
          local_c8._20_8_ = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          convert_packing(bottom_blob,&local_c8,1,&local_78);
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = 0;
          local_118._20_8_ = 0;
          local_118.allocator = (Allocator *)0x0;
          local_118.dims = 0;
          local_118.w = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          iVar38 = ShuffleChannel::forward
                             (&this->super_ShuffleChannel,&local_c8,&local_118,&local_78);
          if (iVar38 == 0) {
            convert_packing(&local_118,top_blob,4,opt);
          }
          piVar4 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_118.allocator == (Allocator *)0x0) {
                if (local_118.data != (void *)0x0) {
                  free(local_118.data);
                }
              }
              else {
                (*(local_118.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar4 == (int *)0x0) {
            return iVar38;
          }
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 != 0) {
            return iVar38;
          }
          if (local_c8.allocator != (Allocator *)0x0) {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
            return iVar38;
          }
          if (local_c8.data == (void *)0x0) {
            return iVar38;
          }
          free(local_c8.data);
          return iVar38;
        }
        Mat::create(top_blob,iVar38,iVar3,_c,sVar27,4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (iVar39 == 2) {
          if (0 < iVar24) {
            lVar33 = 1;
            lVar29 = 0;
            uVar37 = 0;
            uVar35 = uVar25;
            do {
              if (0 < iVar28) {
                pvVar26 = top_blob->data;
                pvVar5 = bottom_blob->data;
                lVar31 = bottom_blob->cstep * bottom_blob->elemsize;
                lVar30 = top_blob->cstep * top_blob->elemsize;
                lVar34 = 0;
                iVar38 = iVar28;
                do {
                  puVar1 = (undefined4 *)((long)pvVar5 + lVar34 + lVar31 * uVar37);
                  uVar9 = puVar1[1];
                  uVar10 = puVar1[2];
                  uVar11 = puVar1[3];
                  puVar2 = (undefined4 *)((long)pvVar5 + lVar34 + lVar31 * uVar35);
                  uVar12 = *puVar2;
                  uVar13 = puVar2[1];
                  uVar14 = puVar2[2];
                  uVar15 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar26 + lVar34 + lVar30 * lVar29);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar12;
                  puVar2[2] = uVar9;
                  puVar2[3] = uVar13;
                  puVar1 = (undefined4 *)((long)pvVar26 + lVar34 + lVar30 * lVar33);
                  *puVar1 = uVar10;
                  puVar1[1] = uVar14;
                  puVar1[2] = uVar11;
                  puVar1[3] = uVar15;
                  lVar34 = lVar34 + 0x10;
                  iVar38 = iVar38 + -1;
                } while (iVar38 != 0);
              }
              uVar37 = uVar37 + 1;
              uVar35 = uVar35 + 1;
              lVar29 = lVar29 + 2;
              lVar33 = lVar33 + 2;
            } while (uVar37 != uVar25);
            return 0;
          }
        }
        else if (iVar39 == 3) {
          if (0 < iVar24) {
            local_150 = (ulong)(uint)(iVar24 * 2);
            lVar33 = 2;
            lVar29 = 1;
            lVar30 = 0;
            uVar37 = 0;
            uVar35 = uVar25;
            do {
              if (0 < iVar28) {
                pvVar26 = top_blob->data;
                pvVar5 = bottom_blob->data;
                lVar36 = bottom_blob->cstep * bottom_blob->elemsize;
                lVar34 = top_blob->cstep * top_blob->elemsize;
                lVar31 = 0;
                iVar38 = iVar28;
                do {
                  puVar1 = (undefined4 *)((long)pvVar5 + lVar31 + lVar36 * uVar37);
                  uVar9 = puVar1[1];
                  uVar10 = puVar1[2];
                  uVar11 = puVar1[3];
                  puVar2 = (undefined4 *)((long)pvVar5 + lVar31 + lVar36 * uVar35);
                  uVar12 = *puVar2;
                  uVar13 = puVar2[1];
                  uVar14 = puVar2[2];
                  uVar15 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar5 + lVar31 + lVar36 * local_150);
                  uVar16 = *puVar2;
                  uVar17 = puVar2[1];
                  uVar18 = puVar2[2];
                  uVar19 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar26 + lVar31 + lVar34 * lVar30);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar12;
                  puVar2[2] = uVar16;
                  puVar2[3] = uVar9;
                  puVar1 = (undefined4 *)((long)pvVar26 + lVar31 + lVar34 * lVar29);
                  *puVar1 = uVar13;
                  puVar1[1] = uVar17;
                  puVar1[2] = uVar10;
                  puVar1[3] = uVar14;
                  puVar1 = (undefined4 *)((long)pvVar26 + lVar31 + lVar34 * lVar33);
                  *puVar1 = uVar18;
                  puVar1[1] = uVar11;
                  puVar1[2] = uVar15;
                  puVar1[3] = uVar19;
                  lVar31 = lVar31 + 0x10;
                  iVar38 = iVar38 + -1;
                } while (iVar38 != 0);
              }
              uVar37 = uVar37 + 1;
              lVar33 = lVar33 + 3;
              lVar29 = lVar29 + 3;
              lVar30 = lVar30 + 3;
              local_150 = local_150 + 1;
              uVar35 = uVar35 + 1;
            } while (uVar37 != uVar25);
            return 0;
          }
        }
        else {
          if (iVar39 != 4) goto LAB_0043c991;
          if (0 < iVar24) {
            local_148 = (ulong)(uint)(iVar24 * 2);
            local_128 = (ulong)(uint)(iVar24 * 3);
            local_150 = 3;
            local_130 = 2;
            local_138 = 1;
            lVar33 = 0;
            uVar37 = 0;
            uVar35 = uVar25;
            do {
              if (0 < iVar28) {
                pvVar26 = top_blob->data;
                pvVar5 = bottom_blob->data;
                lVar29 = top_blob->cstep * top_blob->elemsize;
                lVar30 = bottom_blob->cstep * bottom_blob->elemsize;
                lVar31 = 0;
                iVar38 = iVar28;
                do {
                  puVar1 = (undefined4 *)((long)pvVar5 + lVar31 + lVar30 * uVar37);
                  uVar9 = puVar1[1];
                  uVar10 = puVar1[2];
                  uVar11 = puVar1[3];
                  puVar2 = (undefined4 *)((long)pvVar5 + lVar31 + lVar30 * uVar35);
                  uVar12 = *puVar2;
                  uVar13 = puVar2[1];
                  uVar14 = puVar2[2];
                  uVar15 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar5 + lVar31 + lVar30 * local_148);
                  uVar16 = *puVar2;
                  uVar17 = puVar2[1];
                  uVar18 = puVar2[2];
                  uVar19 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar5 + lVar31 + lVar30 * local_128);
                  uVar20 = *puVar2;
                  uVar21 = puVar2[1];
                  uVar22 = puVar2[2];
                  uVar23 = puVar2[3];
                  puVar2 = (undefined4 *)((long)pvVar26 + lVar31 + lVar29 * lVar33);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar12;
                  puVar2[2] = uVar16;
                  puVar2[3] = uVar20;
                  puVar1 = (undefined4 *)((long)pvVar26 + lVar31 + lVar29 * local_138);
                  *puVar1 = uVar9;
                  puVar1[1] = uVar13;
                  puVar1[2] = uVar17;
                  puVar1[3] = uVar21;
                  puVar1 = (undefined4 *)((long)pvVar26 + lVar31 + lVar29 * local_130);
                  *puVar1 = uVar10;
                  puVar1[1] = uVar14;
                  puVar1[2] = uVar18;
                  puVar1[3] = uVar22;
                  puVar1 = (undefined4 *)((long)pvVar26 + lVar31 + lVar29 * local_150);
                  *puVar1 = uVar11;
                  puVar1[1] = uVar15;
                  puVar1[2] = uVar19;
                  puVar1[3] = uVar23;
                  lVar31 = lVar31 + 0x10;
                  iVar38 = iVar38 + -1;
                } while (iVar38 != 0);
              }
              uVar37 = uVar37 + 1;
              local_150 = local_150 + 4;
              local_130 = local_130 + 4;
              local_138 = local_138 + 4;
              lVar33 = lVar33 + 4;
              local_128 = local_128 + 1;
              local_148 = local_148 + 1;
              uVar35 = uVar35 + 1;
            } while (uVar37 != uVar25);
            return 0;
          }
        }
      }
      else {
        Mat::create(top_blob,iVar38,iVar3,_c,sVar27,4,opt->blob_allocator);
        pvVar26 = top_blob->data;
        if (pvVar26 == (void *)0x0) {
          return -100;
        }
        sVar27 = top_blob->cstep;
        if ((long)top_blob->c * sVar27 == 0) {
          return -100;
        }
        if (0 < iVar24) {
          lVar33 = 1;
          lVar29 = 0;
          uVar32 = 0;
          uVar37 = uVar25;
          uVar35 = uVar25;
          do {
            uVar35 = uVar35 + 1;
            if (0 < iVar28) {
              pvVar26 = top_blob->data;
              pvVar5 = bottom_blob->data;
              lVar31 = bottom_blob->cstep * bottom_blob->elemsize;
              lVar30 = top_blob->cstep * top_blob->elemsize;
              lVar34 = 0;
              iVar38 = iVar28;
              do {
                puVar1 = (undefined4 *)((long)pvVar5 + lVar34 + lVar31 * uVar32);
                uVar9 = puVar1[1];
                uVar10 = puVar1[2];
                uVar11 = puVar1[3];
                lVar36 = lVar34 + lVar31 * uVar37;
                uVar12 = *(undefined4 *)((long)pvVar5 + lVar36 + 8);
                uVar13 = *(undefined4 *)((long)pvVar5 + lVar36 + 0xc);
                puVar2 = (undefined4 *)((long)pvVar5 + lVar34 + lVar31 * uVar35);
                uVar14 = *puVar2;
                uVar15 = puVar2[1];
                puVar2 = (undefined4 *)((long)pvVar26 + lVar34 + lVar30 * lVar29);
                *puVar2 = *puVar1;
                puVar2[1] = uVar12;
                puVar2[2] = uVar9;
                puVar2[3] = uVar13;
                puVar1 = (undefined4 *)((long)pvVar26 + lVar34 + lVar30 * lVar33);
                *puVar1 = uVar10;
                puVar1[1] = uVar14;
                puVar1[2] = uVar11;
                puVar1[3] = uVar15;
                lVar34 = lVar34 + 0x10;
                iVar38 = iVar38 + -1;
              } while (iVar38 != 0);
            }
            uVar32 = uVar32 + 1;
            uVar37 = uVar37 + 1;
            lVar29 = lVar29 + 2;
            lVar33 = lVar33 + 2;
          } while (uVar32 != uVar25);
          pvVar26 = top_blob->data;
          sVar27 = top_blob->cstep;
        }
        if (0 < iVar28) {
          sVar6 = bottom_blob->cstep;
          pvVar5 = bottom_blob->data;
          sVar7 = bottom_blob->elemsize;
          sVar8 = top_blob->elemsize;
          lVar33 = 0;
          do {
            puVar1 = (undefined4 *)((long)pvVar5 + lVar33 + (long)iVar24 * sVar6 * sVar7);
            uVar9 = puVar1[1];
            puVar2 = (undefined4 *)((long)pvVar5 + lVar33 + sVar6 * (long)(iVar24 * 2) * sVar7 + 8);
            uVar10 = *puVar2;
            uVar11 = puVar2[1];
            puVar2 = (undefined4 *)((long)pvVar26 + lVar33 + sVar27 * (long)(iVar24 * 2) * sVar8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar10;
            puVar2[2] = uVar9;
            puVar2[3] = uVar11;
            lVar33 = lVar33 + 0x10;
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
          return 0;
        }
      }
      iVar38 = 0;
    }
  }
  return iVar38;
}

Assistant:

int ShuffleChannel_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();
    if (elembits != 32)
    {
        NCNN_LOGE("Elembits = %d is not implemented yet.", elembits);
        return -100;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    int _group = reverse ? channels * elempack / group : group;
    int channels_per_group = channels / _group;

    if (_group == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512i _idxlo = _mm512_set_epi64(
                             0x1700000007, 0x1600000006,
                             0x1500000005, 0x1400000004,
                             0x1300000003, 0x1200000002,
                             0x1100000001, 0x1000000000);
        __m512i _idxhi = _mm512_set_epi64(
                             0x1f0000000f, 0x1e0000000e,
                             0x1d0000000d, 0x1c0000000c,
                             0x1b0000000b, 0x1a0000000a,
                             0x1900000009, 0x1800000008);

        if (_group == 2 && channels % _group != 0)
        {
            top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group + q + 1);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m512 _p0 = _mm512_loadu_ps(ptr0);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    __m512 _p2 = _mm512_loadu_ps(ptr2);

                    __m512 _p12 = _mm512_castsi512_ps(
                                      _mm512_alignr_epi64(_mm512_castps_si512(_p2), _mm512_castps_si512(_p1), 4));

                    __m512 _lo = _mm512_permutex2var_ps(_p0, _idxlo, _p12);
                    __m512 _hi = _mm512_permutex2var_ps(_p0, _idxhi, _p12);

                    _mm512_storeu_ps(outptr0, _lo);
                    _mm512_storeu_ps(outptr1, _hi);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                }
            }

            // handle the last channel
            {
                const float* ptr0 = bottom_blob.channel(channels_per_group);
                const float* ptr1 = bottom_blob.channel(channels_per_group * 2);
                float* outptr = top_blob.channel(channels_per_group * 2);

                ptr1 += 8;

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);

                    __m256 _lo = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _hi = _mm256_unpackhi_ps(_p0, _p1);

                    __m256 _lo_ = _mm256_permute2f128_ps(_lo, _hi, 0x20);
                    __m256 _hi_ = _mm256_permute2f128_ps(_lo, _hi, 0x31);

                    _mm256_storeu_ps(outptr, _lo_);
                    _mm256_storeu_ps(outptr + 8, _hi_);

                    ptr0 += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
            }

            return 0;
        }
        if (_group > 4 || channels % _group != 0)
        {
            // slow path for too large group or shuffle inside elempack
            Option opt_pack = opt;
            opt_pack.blob_allocator = opt.workspace_allocator;

            Mat bottom_blob_unpacked;
            convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

            Mat top_blob_unpacked;
            int ret = ShuffleChannel::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
            if (ret != 0)
                return ret;

            convert_packing(top_blob_unpacked, top_blob, elempack, opt);

            return 0;
        }

        top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (_group == 2)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m512 _p0 = _mm512_loadu_ps(ptr0);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);

                    __m512 _lo = _mm512_permutex2var_ps(_p0, _idxlo, _p1);
                    __m512 _hi = _mm512_permutex2var_ps(_p0, _idxhi, _p1);

                    _mm512_storeu_ps(outptr0, _lo);
                    _mm512_storeu_ps(outptr1, _hi);

                    ptr0 += 16;
                    ptr1 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                }
            }

            return 0;
        }
        if (_group == 3)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                float* outptr0 = top_blob.channel(q * 3);
                float* outptr1 = top_blob.channel(q * 3 + 1);
                float* outptr2 = top_blob.channel(q * 3 + 2);

                for (int i = 0; i < size; i++)
                {
                    // TODO Naive implementation
                    /*
                    0123456789abcdef        0gw1hx2iy3jz4kA5
                    ghijklmnopqrstuv  --->  lB6mC7nD8oE9pFaq
                    wxyzABCDEFGHIJKL        GbrHcsIdtJeuKfvL
                    */

                    outptr0[0] = ptr0[0];
                    outptr0[1] = ptr1[0];
                    outptr0[2] = ptr2[0];
                    outptr0[3] = ptr0[1];
                    outptr0[4] = ptr1[1];
                    outptr0[5] = ptr2[1];
                    outptr0[6] = ptr0[2];
                    outptr0[7] = ptr1[2];
                    outptr0[8] = ptr2[2];
                    outptr0[9] = ptr0[3];
                    outptr0[10] = ptr1[3];
                    outptr0[11] = ptr2[3];
                    outptr0[12] = ptr0[4];
                    outptr0[13] = ptr1[4];
                    outptr0[14] = ptr2[4];
                    outptr0[15] = ptr0[5];

                    outptr1[0] = ptr1[5];
                    outptr1[1] = ptr2[5];
                    outptr1[2] = ptr0[6];
                    outptr1[3] = ptr1[6];
                    outptr1[4] = ptr2[6];
                    outptr1[5] = ptr0[7];
                    outptr1[6] = ptr1[7];
                    outptr1[7] = ptr2[7];
                    outptr1[8] = ptr0[8];
                    outptr1[9] = ptr1[8];
                    outptr1[10] = ptr2[8];
                    outptr1[11] = ptr0[9];
                    outptr1[12] = ptr1[9];
                    outptr1[13] = ptr2[9];
                    outptr1[14] = ptr0[10];
                    outptr1[15] = ptr1[10];

                    outptr2[0] = ptr2[10];
                    outptr2[1] = ptr0[11];
                    outptr2[2] = ptr1[11];
                    outptr2[3] = ptr2[11];
                    outptr2[4] = ptr0[12];
                    outptr2[5] = ptr1[12];
                    outptr2[6] = ptr2[12];
                    outptr2[7] = ptr0[13];
                    outptr2[8] = ptr1[13];
                    outptr2[9] = ptr2[13];
                    outptr2[10] = ptr0[14];
                    outptr2[11] = ptr1[14];
                    outptr2[12] = ptr2[14];
                    outptr2[13] = ptr0[15];
                    outptr2[14] = ptr1[15];
                    outptr2[15] = ptr2[15];

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                }
            }

            return 0;
        }
        if (_group == 4)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                const float* ptr3 = bottom_blob.channel(channels_per_group * 3 + q);
                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    __m512 _p0 = _mm512_loadu_ps(ptr0);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    __m512 _p2 = _mm512_loadu_ps(ptr2);
                    __m512 _p3 = _mm512_loadu_ps(ptr3);

                    __m512 _lo02 = _mm512_permutex2var_ps(_p0, _idxlo, _p2);
                    __m512 _hi02 = _mm512_permutex2var_ps(_p0, _idxhi, _p2);
                    __m512 _lo13 = _mm512_permutex2var_ps(_p1, _idxlo, _p3);
                    __m512 _hi13 = _mm512_permutex2var_ps(_p1, _idxhi, _p3);

                    __m512 _lolo = _mm512_permutex2var_ps(_lo02, _idxlo, _lo13);
                    __m512 _lohi = _mm512_permutex2var_ps(_lo02, _idxhi, _lo13);
                    __m512 _hilo = _mm512_permutex2var_ps(_hi02, _idxlo, _hi13);
                    __m512 _hihi = _mm512_permutex2var_ps(_hi02, _idxhi, _hi13);

                    _mm512_storeu_ps(outptr0, _lolo);
                    _mm512_storeu_ps(outptr1, _lohi);
                    _mm512_storeu_ps(outptr2, _hilo);
                    _mm512_storeu_ps(outptr3, _hihi);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                }
            }

            return 0;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (_group == 2 && channels % _group != 0)
        {
            top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group + q + 1);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                ptr1 += 4;

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);

                    __m256 _p1 = _mm256_castps128_ps256(_mm_loadu_ps(ptr1));
                    _p1 = _mm256_insertf128_ps(_p1, _mm_loadu_ps(ptr2), 1);

                    __m256 _lo = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _hi = _mm256_unpackhi_ps(_p0, _p1);

                    __m256 _lo_ = _mm256_permute2f128_ps(_lo, _hi, 0x20);
                    __m256 _hi_ = _mm256_permute2f128_ps(_lo, _hi, 0x31);

                    _mm256_storeu_ps(outptr0, _lo_);
                    _mm256_storeu_ps(outptr1, _hi_);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                }
            }

            // handle the last channel
            {
                const float* ptr0 = bottom_blob.channel(channels_per_group);
                const float* ptr1 = bottom_blob.channel(channels_per_group * 2);
                float* outptr = top_blob.channel(channels_per_group * 2);

                ptr1 += 4;

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p1);
                    __m128 _hi = _mm_unpackhi_ps(_p0, _p1);

                    _mm_storeu_ps(outptr, _lo);
                    _mm_storeu_ps(outptr + 4, _hi);

                    ptr0 += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            return 0;
        }
        if (_group > 4 || channels % _group != 0)
        {
            // slow path for too large group or shuffle inside elempack
            Option opt_pack = opt;
            opt_pack.blob_allocator = opt.workspace_allocator;

            Mat bottom_blob_unpacked;
            convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);
            if (bottom_blob_unpacked.empty())
                return -100;

            Mat top_blob_unpacked;
            int ret = ShuffleChannel::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
            if (ret != 0)
                return ret;

            convert_packing(top_blob_unpacked, top_blob, elempack, opt);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (_group == 2)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);

                    __m256 _lo = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _hi = _mm256_unpackhi_ps(_p0, _p1);

                    __m256 _lo_ = _mm256_permute2f128_ps(_lo, _hi, 0x20);
                    __m256 _hi_ = _mm256_permute2f128_ps(_lo, _hi, 0x31);

                    _mm256_storeu_ps(outptr0, _lo_);
                    _mm256_storeu_ps(outptr1, _hi_);

                    ptr0 += 8;
                    ptr1 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                }
            }

            return 0;
        }
        if (_group == 3)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                float* outptr0 = top_blob.channel(q * 3);
                float* outptr1 = top_blob.channel(q * 3 + 1);
                float* outptr2 = top_blob.channel(q * 3 + 2);

                for (int i = 0; i < size; i++)
                {
                    // TODO figure out a faster way
                    /*
                    01234567        08g19h2a
                    89abcdef  --->  i3bj4ck5
                    ghijklmn        dl6em7fn
                    */

                    __m256 _p0 = _mm256_loadu_ps(ptr0); // 01234567
                    __m256 _p1 = _mm256_loadu_ps(ptr1); // 89abcdef
                    __m256 _p2 = _mm256_loadu_ps(ptr2); // ghijklmn

                    __m256 _08194c5d = _mm256_unpacklo_ps(_p0, _p1);
                    __m256 _2a3b6e7f = _mm256_unpackhi_ps(_p0, _p1);
                    __m256 _8g9hckdl = _mm256_unpacklo_ps(_p1, _p2);
                    __m256 _aibjemfn = _mm256_unpackhi_ps(_p1, _p2);
                    __m256 _0g1h4k5l = _mm256_unpacklo_ps(_p0, _p2);
                    __m256 _2i3j6m7n = _mm256_unpackhi_ps(_p0, _p2);

                    __m256 _i3g1m7k5 = _mm256_shuffle_ps(_2i3j6m7n, _0g1h4k5l, _MM_SHUFFLE(2, 1, 2, 1));

                    __m256 _9h2adl6e = _mm256_shuffle_ps(_8g9hckdl, _2a3b6e7f, _MM_SHUFFLE(1, 0, 3, 2));
                    __m256 _08g14ck5 = _mm256_shuffle_ps(_08194c5d, _i3g1m7k5, _MM_SHUFFLE(3, 2, 1, 0));
                    __m256 _i3bjm7fn = _mm256_shuffle_ps(_i3g1m7k5, _aibjemfn, _MM_SHUFFLE(3, 2, 1, 0));

                    __m256 _08g19h2a = _mm256_permute2f128_ps(_08g14ck5, _9h2adl6e, 0x20); // 0 2
                    __m256 _i3bj4ck5 = _mm256_permute2f128_ps(_i3bjm7fn, _08g14ck5, 0x30); // 0 3
                    __m256 _dl6em7fn = _mm256_permute2f128_ps(_9h2adl6e, _i3bjm7fn, 0x31); // 1 3

                    _mm256_storeu_ps(outptr0, _08g19h2a);
                    _mm256_storeu_ps(outptr1, _i3bj4ck5);
                    _mm256_storeu_ps(outptr2, _dl6em7fn);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                }
            }

            return 0;
        }
        if (_group == 4)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                const float* ptr3 = bottom_blob.channel(channels_per_group * 3 + q);
                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p0 = _mm256_loadu_ps(ptr0);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    __m256 _p2 = _mm256_loadu_ps(ptr2);
                    __m256 _p3 = _mm256_loadu_ps(ptr3);

                    __m256 _lo02 = _mm256_unpacklo_ps(_p0, _p2);
                    __m256 _hi02 = _mm256_unpackhi_ps(_p0, _p2);
                    __m256 _lo13 = _mm256_unpacklo_ps(_p1, _p3);
                    __m256 _hi13 = _mm256_unpackhi_ps(_p1, _p3);

                    __m256 _lolo = _mm256_unpacklo_ps(_lo02, _lo13);
                    __m256 _lohi = _mm256_unpackhi_ps(_lo02, _lo13);
                    __m256 _hilo = _mm256_unpacklo_ps(_hi02, _hi13);
                    __m256 _hihi = _mm256_unpackhi_ps(_hi02, _hi13);

                    __m256 _lolo_ = _mm256_permute2f128_ps(_lolo, _lohi, 0x20);
                    __m256 _lohi_ = _mm256_permute2f128_ps(_hilo, _hihi, 0x20);
                    __m256 _hilo_ = _mm256_permute2f128_ps(_lolo, _lohi, 0x31);
                    __m256 _hihi_ = _mm256_permute2f128_ps(_hilo, _hihi, 0x31);

                    _mm256_storeu_ps(outptr0, _lolo_);
                    _mm256_storeu_ps(outptr1, _lohi_);
                    _mm256_storeu_ps(outptr2, _hilo_);
                    _mm256_storeu_ps(outptr3, _hihi_);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                }
            }

            return 0;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        if (_group == 2 && channels % _group != 0)
        {
            top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group + q + 1);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);
                    __m128 _p2 = _mm_loadu_ps(ptr2);

                    __m128 _p12 = _mm_shuffle_ps(_p1, _p2, _MM_SHUFFLE(1, 0, 3, 2));

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p12);
                    __m128 _hi = _mm_unpackhi_ps(_p0, _p12);

                    _mm_storeu_ps(outptr0, _lo);
                    _mm_storeu_ps(outptr1, _hi);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }

            // handle the last channel
            {
                const float* ptr0 = bottom_blob.channel(channels_per_group);
                const float* ptr1 = bottom_blob.channel(channels_per_group * 2);
                float* outptr = top_blob.channel(channels_per_group * 2);

                ptr1 += 2;

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p1);

                    _mm_storeu_ps(outptr, _lo);

                    ptr0 += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            return 0;
        }
        if (_group > 4 || channels % _group != 0)
        {
            // slow path for too large group or shuffle inside elempack
            Option opt_pack = opt;
            opt_pack.blob_allocator = opt.workspace_allocator;

            Mat bottom_blob_unpacked;
            convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

            Mat top_blob_unpacked;
            int ret = ShuffleChannel::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
            if (ret != 0)
                return ret;

            convert_packing(top_blob_unpacked, top_blob, elempack, opt);

            return 0;
        }

        top_blob.create(w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (_group == 2)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);

                    __m128 _lo = _mm_unpacklo_ps(_p0, _p1);
                    __m128 _hi = _mm_unpackhi_ps(_p0, _p1);

                    _mm_storeu_ps(outptr0, _lo);
                    _mm_storeu_ps(outptr1, _hi);

                    ptr0 += 4;
                    ptr1 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }

            return 0;
        }
        if (_group == 3)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                float* outptr0 = top_blob.channel(q * 3);
                float* outptr1 = top_blob.channel(q * 3 + 1);
                float* outptr2 = top_blob.channel(q * 3 + 2);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);
                    __m128 _p2 = _mm_loadu_ps(ptr2);

                    __m128 _0415 = _mm_unpacklo_ps(_p0, _p1);
                    __m128 _2637 = _mm_unpackhi_ps(_p0, _p1);
                    __m128 _4859 = _mm_unpacklo_ps(_p1, _p2);
                    __m128 _6a7b = _mm_unpackhi_ps(_p1, _p2);

                    __m128 _138a = _mm_shuffle_ps(_p0, _p2, _MM_SHUFFLE(2, 0, 3, 1));

                    __m128 _0481 = _mm_shuffle_ps(_0415, _138a, _MM_SHUFFLE(0, 2, 1, 0));
                    __m128 _5926 = _mm_shuffle_ps(_4859, _2637, _MM_SHUFFLE(1, 0, 3, 2));
                    __m128 _a37b = _mm_shuffle_ps(_138a, _6a7b, _MM_SHUFFLE(3, 2, 1, 3));

                    _mm_storeu_ps(outptr0, _0481);
                    _mm_storeu_ps(outptr1, _5926);
                    _mm_storeu_ps(outptr2, _a37b);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                }
            }

            return 0;
        }
        if (_group == 4)
        {
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr0 = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob.channel(channels_per_group + q);
                const float* ptr2 = bottom_blob.channel(channels_per_group * 2 + q);
                const float* ptr3 = bottom_blob.channel(channels_per_group * 3 + q);
                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p0 = _mm_loadu_ps(ptr0);
                    __m128 _p1 = _mm_loadu_ps(ptr1);
                    __m128 _p2 = _mm_loadu_ps(ptr2);
                    __m128 _p3 = _mm_loadu_ps(ptr3);

                    __m128 _lo02 = _mm_unpacklo_ps(_p0, _p2);
                    __m128 _hi02 = _mm_unpackhi_ps(_p0, _p2);
                    __m128 _lo13 = _mm_unpacklo_ps(_p1, _p3);
                    __m128 _hi13 = _mm_unpackhi_ps(_p1, _p3);

                    __m128 _lolo = _mm_unpacklo_ps(_lo02, _lo13);
                    __m128 _lohi = _mm_unpackhi_ps(_lo02, _lo13);
                    __m128 _hilo = _mm_unpacklo_ps(_hi02, _hi13);
                    __m128 _hihi = _mm_unpackhi_ps(_hi02, _hi13);

                    _mm_storeu_ps(outptr0, _lolo);
                    _mm_storeu_ps(outptr1, _lohi);
                    _mm_storeu_ps(outptr2, _hilo);
                    _mm_storeu_ps(outptr3, _hihi);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
            }

            return 0;
        }
    }
#endif // __SSE2__

    return ShuffleChannel::forward(bottom_blob, top_blob, opt);
}